

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cpp
# Opt level: O1

Vector3D * __thiscall
CMU462::UniformHemisphereSampler3D::get_sample
          (Vector3D *__return_storage_ptr__,UniformHemisphereSampler3D *this)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  
  iVar1 = rand();
  iVar2 = rand();
  dVar8 = acos((double)iVar1 / 2147483647.0);
  fVar7 = ((float)iVar2 / 2.1474836e+09) * 6.2831855;
  fVar3 = (float)dVar8;
  fVar4 = sinf(fVar3);
  fVar5 = cosf(fVar7);
  fVar6 = sinf(fVar3);
  fVar7 = sinf(fVar7);
  fVar3 = cosf(fVar3);
  __return_storage_ptr__->x = (double)(fVar5 * fVar4);
  __return_storage_ptr__->y = (double)(fVar7 * fVar6);
  __return_storage_ptr__->z = (double)fVar3;
  return __return_storage_ptr__;
}

Assistant:

Vector3D UniformHemisphereSampler3D::get_sample() const {

    double Xi1 = (double)(std::rand()) / RAND_MAX;
    double Xi2 = (double)(std::rand()) / RAND_MAX;

    double theta = acos(Xi1);
    double phi = 2.0 * PI * Xi2;

    double xs = sinf(theta) * cosf(phi);
    double ys = sinf(theta) * sinf(phi);
    double zs = cosf(theta);

    return Vector3D(xs, ys, zs);

  }